

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>
wabt::MakeUnique<wabt::ModuleCommand>(void)

{
  ModuleCommand *this;
  __uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true> in_RDI;
  
  this = (ModuleCommand *)operator_new(0x380);
  memset(this,0,0x380);
  ModuleCommand::ModuleCommand(this);
  *(ModuleCommand **)
   in_RDI.super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
   .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
   super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>,_true,_true>
         )(tuple<wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>)
          in_RDI.
          super___uniq_ptr_impl<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_>._M_t
          .super__Tuple_impl<0UL,_wabt::ModuleCommand_*,_std::default_delete<wabt::ModuleCommand>_>.
          super__Head_base<0UL,_wabt::ModuleCommand_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}